

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o1.cc
# Opt level: O0

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::SegmentO1::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,SegmentO1 *this,RefinementPattern *ref_pat,dim_t codim)

{
  RefElType RVar1;
  RefElType RVar2;
  size_type sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  size_type from;
  reference pvVar9;
  Index IVar10;
  ulong uVar11;
  string local_d00;
  allocator<char> local_cd9;
  string local_cd8;
  allocator<char> local_cb1;
  string local_cb0;
  stringstream local_c90 [8];
  stringstream ss_5;
  ostream local_c80 [376];
  undefined1 local_b08 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_b00;
  undefined1 local_af8 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_af0;
  Type local_ae8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_ad8;
  Matrix<double,__1,__1,_0,__1,__1> local_aa0;
  undefined1 local_a88 [8];
  MatrixXd child_geo;
  allocator<char> local_a49;
  string local_a48;
  allocator<char> local_a21;
  string local_a20;
  stringstream local_a00 [8];
  stringstream ss_4;
  ostream local_9f0 [376];
  string local_878;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  stringstream local_808 [8];
  stringstream ss_3;
  ostream local_7f8 [380];
  int local_67c;
  undefined1 local_678 [4];
  int i;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  stringstream local_608 [8];
  stringstream ss_2;
  ostream local_5f8 [380];
  int local_47c;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_478 [4];
  int no_children;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  child_polygons;
  double local_458;
  double h_lattice;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  stringstream local_3e0 [8];
  stringstream ss_1;
  ostream local_3d0 [376];
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  RefEl local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [378];
  RefEl local_26;
  RefEl local_25;
  dim_t local_24;
  RefinementPattern *pRStack_20;
  dim_t codim_local;
  RefinementPattern *ref_pat_local;
  SegmentO1 *this_local;
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  *child_geo_uptrs;
  
  local_24 = codim;
  pRStack_20 = ref_pat;
  ref_pat_local = (RefinementPattern *)this;
  this_local = (SegmentO1 *)__return_storage_ptr__;
  local_25 = RefinementPattern::RefEl(ref_pat);
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_25);
  local_26 = lf::base::RefEl::kSegment();
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_26);
  if (RVar1 != RVar2) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar7 = std::operator<<(local_1a0,"Refinement pattern for ");
    local_1e1 = RefinementPattern::RefEl(pRStack_20);
    lf::base::RefEl::ToString_abi_cxx11_(&local_1e0,&local_1e1);
    std::operator<<(poVar7,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"ref_pat.RefEl() == lf::base::RefEl::kSegment()",&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
               ,&local_231);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_208,&local_230,0x31,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"this code should not be reached");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_24 < 2) {
    sVar3 = RefinementPattern::LatticeConst(pRStack_20);
    local_458 = 1.0 / (double)sVar3;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    ::vector(__return_storage_ptr__);
    (**(code **)(*(long *)pRStack_20 + 8))(local_478,pRStack_20,local_24);
    from = std::
           vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
           ::size(local_478);
    iVar4 = lf::base::narrow<int,unsigned_long>(from);
    local_47c = iVar4;
    iVar5 = (*(code *)**(undefined8 **)pRStack_20)(pRStack_20,local_24);
    if (iVar4 != iVar5) {
      std::__cxx11::stringstream::stringstream(local_608);
      poVar7 = std::operator<<(local_5f8,"no_children = ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_47c);
      poVar7 = std::operator<<(poVar7," <-> ");
      uVar6 = (*(code *)**(undefined8 **)pRStack_20)(pRStack_20,local_24);
      std::ostream::operator<<(poVar7,uVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_628,"no_children == ref_pat.NumChildren(codim)",&local_629);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_650,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                 ,&local_651);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_628,&local_650,0x40,(string *)local_678);
      std::__cxx11::string::~string((string *)local_678);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator(&local_651);
      std::__cxx11::string::~string((string *)&local_628);
      std::allocator<char>::~allocator(&local_629);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"this code should not be reached");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_67c = 0;
    while( true ) {
      if (local_47c <= local_67c) {
        std::
        vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
        ::~vector(local_478);
        return __return_storage_ptr__;
      }
      pvVar9 = std::
               vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](local_478,(long)local_67c);
      IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows
                         ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar9);
      if (IVar10 != 1) break;
      pvVar9 = std::
               vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](local_478,(long)local_67c);
      uVar11 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                         ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar9);
      if (uVar11 != 2 - local_24) {
        std::__cxx11::stringstream::stringstream(local_a00);
        poVar7 = std::operator<<(local_9f0,"child_polygons[l].cols() = ");
        pvVar9 = std::
                 vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                 ::operator[](local_478,(long)local_67c);
        IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                           ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar9);
        std::ostream::operator<<(poVar7,IVar10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a20,"child_polygons[i].cols() == (2 - codim)",&local_a21);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a48,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                   ,&local_a49);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed
                  (&local_a20,&local_a48,0x49,
                   (string *)
                   &child_geo.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols);
        std::__cxx11::string::~string
                  ((string *)
                   &child_geo.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols);
        std::__cxx11::string::~string((string *)&local_a48);
        std::allocator<char>::~allocator(&local_a49);
        std::__cxx11::string::~string((string *)&local_a20);
        std::allocator<char>::~allocator(&local_a21);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"this code should not be reached");
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar9 = std::
               vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](local_478,(long)local_67c);
      Eigen::DenseBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cast<double>
                (&local_ae8,(DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar9);
      Eigen::operator*(&local_ad8,&local_458,(StorageBaseType *)&local_ae8);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_aa0,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_ad8);
      (*(this->super_Geometry)._vptr_Geometry[3])(local_a88,this,&local_aa0);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_aa0);
      if (local_24 == 0) {
        std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_af8);
        std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
        unique_ptr<lf::geometry::SegmentO1,std::default_delete<lf::geometry::SegmentO1>,void>
                  ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *
                   )&local_af0,
                   (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                    *)local_af8);
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_af0);
        std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
        ~unique_ptr(&local_af0);
        std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
        ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                     *)local_af8);
      }
      else {
        if (local_24 != 1) {
          std::__cxx11::stringstream::stringstream(local_c90);
          std::operator<<(local_c80,"codim out of bounds.");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_cb0,"false",&local_cb1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_cd8,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                     ,&local_cd9);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_cb0,&local_cd8,0x58,&local_d00);
          std::__cxx11::string::~string((string *)&local_d00);
          std::__cxx11::string::~string((string *)&local_cd8);
          std::allocator<char>::~allocator(&local_cd9);
          std::__cxx11::string::~string((string *)&local_cb0);
          std::allocator<char>::~allocator(&local_cb1);
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,"this code should not be reached");
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::make_unique<lf::geometry::Point,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_b08);
        std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
        unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
                  ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *
                   )&local_b00,
                   (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                   local_b08);
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_b00);
        std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
        ~unique_ptr(&local_b00);
        std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
                  ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                   local_b08);
      }
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_a88);
      local_67c = local_67c + 1;
    }
    std::__cxx11::stringstream::stringstream(local_808);
    poVar7 = std::operator<<(local_7f8,"child_polygons[l].rows() = ");
    pvVar9 = std::
             vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[](local_478,(long)local_67c);
    IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows
                       ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar9);
    std::ostream::operator<<(poVar7,IVar10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_828,"child_polygons[i].rows() == 1",&local_829);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_850,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
               ,&local_851);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_828,&local_850,0x47,&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)&local_850);
    std::allocator<char>::~allocator(&local_851);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator(&local_829);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"this code should not be reached");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_3e0);
  poVar7 = std::operator<<(local_3d0,"Illegal codim = ");
  std::ostream::operator<<(poVar7,local_24);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"(codim < 2)",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
             ,&local_429);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_400,&local_428,0x32,(string *)&h_lattice);
  std::__cxx11::string::~string((string *)&h_lattice);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar8,"this code should not be reached");
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<std::unique_ptr<Geometry>> SegmentO1::ChildGeometry(
    const RefinementPattern& ref_pat, base::dim_t codim) const {
  // The refinement pattern must be for a segment
  LF_VERIFY_MSG(ref_pat.RefEl() == lf::base::RefEl::kSegment(),
                "Refinement pattern for " << ref_pat.RefEl().ToString());
  LF_VERIFY_MSG((codim < 2), "Illegal codim = " << codim);

  // Lattice meshwidth
  const double h_lattice = 1.0 / static_cast<double>(ref_pat.LatticeConst());
  // Return variable
  std::vector<std::unique_ptr<Geometry>> child_geo_uptrs{};

  // Obtain geometry of children as vector of pairs of lattice coordinates
  std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>>
      child_polygons(ref_pat.ChildPolygons(codim));
  // Number of child entities
  const int no_children = base::narrow<int>(child_polygons.size());
  LF_VERIFY_MSG(
      no_children == ref_pat.NumChildren(codim),
      "no_children = " << no_children << " <-> " << ref_pat.NumChildren(codim));
  // For each child create a geometry object and a unique pointer to it.
  for (int i = 0; i < no_children; i++) {
    // codim == 0:A single child must be described by an interval, that is
    // two different lattice coordinates
    // codim == 1: a point's location is just one number
    LF_VERIFY_MSG(child_polygons[i].rows() == 1,
                  "child_polygons[l].rows() = " << child_polygons[i].rows());
    LF_VERIFY_MSG(child_polygons[i].cols() == (2 - codim),
                  "child_polygons[l].cols() = " << child_polygons[i].cols());
    // Normalize lattice coordinates
    const Eigen::MatrixXd child_geo(
        Global(h_lattice * child_polygons[i].cast<double>()));

    switch (codim) {
      case 0: {
        child_geo_uptrs.push_back(std::make_unique<SegmentO1>(child_geo));
        break;
      }
      case 1: {
        child_geo_uptrs.push_back(std::make_unique<Point>(child_geo));
        break;
      }
      default:
        LF_VERIFY_MSG(false, "codim out of bounds.");
    }  // end switch codim
  }  // end loop over child entities
  return child_geo_uptrs;
}